

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined4 *puVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  vfloat_impl<4> vVar8;
  vfloat_impl<4> vVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  undefined8 uVar20;
  undefined8 uVar21;
  uint uVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  ulong uVar25;
  undefined4 uVar26;
  QuadMesh *mesh;
  size_t sVar27;
  NodeRef root;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  float *vertices1;
  long lVar32;
  vuint<4> *v;
  long lVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar34;
  ulong uVar35;
  ulong uVar36;
  NodeRef *pNVar37;
  bool bVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar68;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar64;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar65;
  float fVar66;
  float fVar67;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  float fVar69;
  float fVar92;
  float fVar93;
  undefined1 auVar70 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar128;
  float fVar134;
  vint4 ai_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  vint4 ai;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar164;
  float fVar176;
  float fVar177;
  vint4 ai_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar178;
  undefined1 auVar175 [16];
  float fVar179;
  float fVar191;
  float fVar192;
  vint4 ai_3;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar193;
  undefined1 auVar190 [16];
  float fVar194;
  float fVar203;
  float fVar204;
  vint4 bi;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar206;
  float fVar216;
  float fVar217;
  vint4 bi_1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar218;
  float fVar219;
  float fVar229;
  float fVar230;
  vint4 bi_3;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar231;
  undefined1 auVar228 [16];
  float fVar232;
  float fVar241;
  float fVar242;
  vint4 bi_2;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar243;
  undefined1 auVar240 [16];
  float fVar244;
  float fVar248;
  float fVar249;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar250;
  float fVar251;
  float fVar256;
  float fVar257;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar258;
  undefined1 auVar255 [16];
  float fVar259;
  float fVar265;
  float fVar266;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar267;
  float fVar268;
  float fVar270;
  float fVar271;
  undefined1 auVar269 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar278 [16];
  float fVar277;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar279 [64];
  vuint<4> *v_1;
  undefined1 local_38e8 [8];
  float fStack_38e0;
  float fStack_38dc;
  undefined1 local_38c8 [8];
  float fStack_38c0;
  float fStack_38bc;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  undefined1 local_3828 [8];
  float fStack_3820;
  float fStack_381c;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  float local_36f8;
  float fStack_36f4;
  float fStack_36f0;
  undefined1 local_3688 [8];
  float fStack_3680;
  float fStack_367c;
  undefined1 local_3678 [8];
  float fStack_3670;
  float fStack_366c;
  undefined1 local_3668 [8];
  float fStack_3660;
  float fStack_365c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  auVar7 = mm_lookupmask_ps._240_16_;
  uVar21 = mm_lookupmask_ps._8_8_;
  uVar20 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar127 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar72 = vpcmpeqd_avx(auVar127,(undefined1  [16])valid_i->field_0);
    auVar70 = ZEXT816(0) << 0x40;
    auVar90 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar70,5);
    auVar84 = auVar72 & auVar90;
    if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar84[0xf] < '\0')
    {
      auVar90 = vandps_avx(auVar90,auVar72);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar252._8_4_ = 0x7fffffff;
      auVar252._0_8_ = 0x7fffffff7fffffff;
      auVar252._12_4_ = 0x7fffffff;
      auVar72 = vandps_avx(auVar252,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar233._8_4_ = 0x219392ef;
      auVar233._0_8_ = 0x219392ef219392ef;
      auVar233._12_4_ = 0x219392ef;
      auVar84 = vcmpps_avx(auVar72,auVar233,1);
      auVar260._8_4_ = 0x3f800000;
      auVar260._0_8_ = &DAT_3f8000003f800000;
      auVar260._12_4_ = 0x3f800000;
      auVar155 = vdivps_avx(auVar260,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar72 = vandps_avx(auVar252,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar54 = vcmpps_avx(auVar72,auVar233,1);
      auVar85 = vdivps_avx(auVar260,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar72 = vandps_avx(auVar252,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar72 = vcmpps_avx(auVar72,auVar233,1);
      auVar234._8_4_ = 0x5d5e0b6b;
      auVar234._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar234._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar155,auVar234,auVar84)
      ;
      auVar84 = vdivps_avx(auVar260,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar85,auVar234,auVar54);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar84,auVar234,auVar72);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar70,1);
      auVar155._8_4_ = 0x20;
      auVar155._0_8_ = 0x2000000020;
      auVar155._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar72,auVar155);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar70,5);
      auVar84._8_4_ = 0x40;
      auVar84._0_8_ = 0x4000000040;
      auVar84._12_4_ = 0x40;
      auVar85._8_4_ = 0x60;
      auVar85._0_8_ = 0x6000000060;
      auVar85._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar85,auVar84,auVar72);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar70,5);
      auVar54._8_4_ = 0x80;
      auVar54._0_8_ = 0x8000000080;
      auVar54._12_4_ = 0x80;
      auVar180._8_4_ = 0xa0;
      auVar180._0_8_ = 0xa0000000a0;
      auVar180._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar180,auVar54,auVar72)
      ;
      auVar72 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar70);
      auVar84 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar70);
      auVar70._8_4_ = 0x7f800000;
      auVar70._0_8_ = 0x7f8000007f800000;
      auVar70._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar70,auVar72,auVar90);
      auVar72._8_4_ = 0xff800000;
      auVar72._0_8_ = 0xff800000ff800000;
      auVar72._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar72,auVar84,auVar90);
      terminated.field_0.i[1] = auVar90._4_4_ ^ auVar127._4_4_;
      terminated.field_0.i[0] = auVar90._0_4_ ^ auVar127._0_4_;
      terminated.field_0.i[2] = auVar90._8_4_ ^ auVar127._8_4_;
      terminated.field_0.i[3] = auVar90._12_4_ ^ auVar127._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 3;
      }
      else {
        uVar30 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar37 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar34 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar279 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      do {
        paVar34 = paVar34 + -1;
        root.ptr = pNVar37[-1].ptr;
        pNVar37 = pNVar37 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00632ef9:
          iVar23 = 3;
        }
        else {
          aVar71 = *paVar34;
          auVar127 = vcmpps_avx((undefined1  [16])aVar71,(undefined1  [16])tray.tfar.field_0,1);
          uVar22 = vmovmskps_avx(auVar127);
          if (uVar22 == 0) {
LAB_00632f0a:
            iVar23 = 2;
          }
          else {
            uVar36 = (ulong)(uVar22 & 0xff);
            uVar22 = POPCOUNT(uVar22 & 0xff);
            iVar23 = 0;
            if (uVar22 <= uVar30) {
              do {
                sVar27 = 0;
                for (uVar24 = uVar36; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000)
                {
                  sVar27 = sVar27 + 1;
                }
                bVar38 = occluded1(This,bvh,root,sVar27,&pre,ray,&tray,context);
                if (bVar38) {
                  terminated.field_0.i[sVar27] = -1;
                }
                uVar36 = uVar36 - 1 & uVar36;
              } while (uVar36 != 0);
              auVar127 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar23 = 3;
              auVar279 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              if ((((auVar127 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar127 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar127 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar127[0xf] < '\0') {
                auVar127._8_4_ = 0xff800000;
                auVar127._0_8_ = 0xff800000ff800000;
                auVar127._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar127,
                                   (undefined1  [16])terminated.field_0);
                iVar23 = 2;
              }
            }
            auVar91 = ZEXT1664((undefined1  [16])aVar71);
            if (uVar30 < uVar22) {
              do {
                uVar22 = (uint)root.ptr;
                auVar127 = auVar91._0_16_;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00632ef9;
                  auVar72 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar127,6);
                  if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar72[0xf] < '\0') {
                    uVar36 = (ulong)(uVar22 & 0xf);
                    if (uVar36 == 8) {
                      auVar127 = vpcmpeqd_avx(auVar127,auVar127);
                      aVar65 = terminated.field_0;
                    }
                    else {
                      auVar73._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                      auVar73._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                      auVar73._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                      uVar24 = 0;
                      do {
                        lVar33 = uVar24 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        uVar26 = vmovmskps_avx(auVar73);
                        uVar10 = 0;
                        uVar25 = CONCAT44((int)(uVar24 >> 0x20),uVar26);
                        for (uVar35 = uVar25; (uVar35 & 1) == 0;
                            uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                          uVar10 = uVar10 + 1;
                        }
                        auVar91 = ZEXT1664(auVar73);
                        uVar35 = 0;
                        while (auVar127 = auVar91._0_16_, *(int *)(lVar33 + 0x50 + uVar35 * 4) != -1
                              ) {
                          pGVar4 = (context->scene->geometries).items
                                   [*(uint *)(lVar33 + 0x40 + uVar35 * 4)].ptr;
                          fVar39 = (pGVar4->time_range).lower;
                          auVar40._4_4_ = fVar39;
                          auVar40._0_4_ = fVar39;
                          auVar40._8_4_ = fVar39;
                          auVar40._12_4_ = fVar39;
                          fVar66 = pGVar4->fnumTimeSegments;
                          auVar72 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar40);
                          fVar39 = (pGVar4->time_range).upper - fVar39;
                          auVar41._4_4_ = fVar39;
                          auVar41._0_4_ = fVar39;
                          auVar41._8_4_ = fVar39;
                          auVar41._12_4_ = fVar39;
                          auVar72 = vdivps_avx(auVar72,auVar41);
                          auVar42._0_4_ = fVar66 * auVar72._0_4_;
                          auVar42._4_4_ = fVar66 * auVar72._4_4_;
                          auVar42._8_4_ = fVar66 * auVar72._8_4_;
                          auVar42._12_4_ = fVar66 * auVar72._12_4_;
                          auVar72 = vroundps_avx(auVar42,1);
                          fVar66 = fVar66 + -1.0;
                          auVar108._4_4_ = fVar66;
                          auVar108._0_4_ = fVar66;
                          auVar108._8_4_ = fVar66;
                          auVar108._12_4_ = fVar66;
                          auVar72 = vminps_avx(auVar72,auVar108);
                          auVar72 = vmaxps_avx(auVar72,_DAT_01feba10);
                          auVar84 = vsubps_avx(auVar42,auVar72);
                          itime.field_0 =
                               (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar72);
                          iVar23 = itime.field_0.i[uVar10];
                          auVar109._4_4_ = iVar23;
                          auVar109._0_4_ = iVar23;
                          auVar109._8_4_ = iVar23;
                          auVar109._12_4_ = iVar23;
                          auVar72 = vpcmpeqd_avx(auVar109,(undefined1  [16])itime.field_0);
                          auVar72 = auVar73 & ~auVar72;
                          fVar66 = auVar84._4_4_;
                          fVar67 = auVar84._8_4_;
                          fVar68 = auVar84._12_4_;
                          fVar39 = auVar84._0_4_;
                          if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar72 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar72[0xf]) {
                            lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives +
                                             (long)iVar23 * 0x38);
                            lVar32 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 +
                                              (long)iVar23 * 0x38);
                            uVar28 = (ulong)*(uint *)(lVar33 + uVar35 * 4);
                            uVar31 = (ulong)*(uint *)(lVar33 + 0x10 + uVar35 * 4);
                            uVar26 = *(undefined4 *)(lVar5 + uVar28 * 4);
                            auVar184._4_4_ = uVar26;
                            auVar184._0_4_ = uVar26;
                            auVar184._8_4_ = uVar26;
                            auVar184._12_4_ = uVar26;
                            uVar26 = *(undefined4 *)(lVar5 + 4 + uVar28 * 4);
                            auVar197._4_4_ = uVar26;
                            auVar197._0_4_ = uVar26;
                            auVar197._8_4_ = uVar26;
                            auVar197._12_4_ = uVar26;
                            uVar26 = *(undefined4 *)(lVar5 + 8 + uVar28 * 4);
                            auVar209._4_4_ = uVar26;
                            auVar209._0_4_ = uVar26;
                            auVar209._8_4_ = uVar26;
                            auVar209._12_4_ = uVar26;
                            fVar69 = *(float *)(lVar32 + uVar28 * 4);
                            fVar92 = *(float *)(lVar32 + 4 + uVar28 * 4);
                            fVar93 = *(float *)(lVar32 + 8 + uVar28 * 4);
                            auVar74._8_4_ = 0x3f800000;
                            auVar74._0_8_ = &DAT_3f8000003f800000;
                            auVar74._12_4_ = 0x3f800000;
                            auVar72 = vsubps_avx(auVar74,auVar84);
                            auVar253._0_4_ = fVar39 * fVar69;
                            auVar253._4_4_ = fVar66 * fVar69;
                            auVar253._8_4_ = fVar67 * fVar69;
                            auVar253._12_4_ = fVar68 * fVar69;
                            auVar149._0_4_ = fVar39 * fVar92;
                            auVar149._4_4_ = fVar66 * fVar92;
                            auVar149._8_4_ = fVar67 * fVar92;
                            auVar149._12_4_ = fVar68 * fVar92;
                            auVar169._0_4_ = fVar39 * fVar93;
                            auVar169._4_4_ = fVar66 * fVar93;
                            auVar169._8_4_ = fVar67 * fVar93;
                            auVar169._12_4_ = fVar68 * fVar93;
                            auVar255 = vfmadd231ps_fma(auVar253,auVar72,auVar184);
                            auVar163 = vfmadd231ps_fma(auVar149,auVar72,auVar197);
                            auVar175 = vfmadd231ps_fma(auVar169,auVar72,auVar209);
                            uVar26 = *(undefined4 *)(lVar5 + uVar31 * 4);
                            auVar185._4_4_ = uVar26;
                            auVar185._0_4_ = uVar26;
                            auVar185._8_4_ = uVar26;
                            auVar185._12_4_ = uVar26;
                            uVar26 = *(undefined4 *)(lVar5 + 4 + uVar31 * 4);
                            auVar198._4_4_ = uVar26;
                            auVar198._0_4_ = uVar26;
                            auVar198._8_4_ = uVar26;
                            auVar198._12_4_ = uVar26;
                            uVar26 = *(undefined4 *)(lVar5 + 8 + uVar31 * 4);
                            auVar210._4_4_ = uVar26;
                            auVar210._0_4_ = uVar26;
                            auVar210._8_4_ = uVar26;
                            auVar210._12_4_ = uVar26;
                            fVar69 = *(float *)(lVar32 + uVar31 * 4);
                            fVar92 = *(float *)(lVar32 + 4 + uVar31 * 4);
                            fVar93 = *(float *)(lVar32 + 8 + uVar31 * 4);
                            auVar110._0_4_ = fVar69 * fVar39;
                            auVar110._4_4_ = fVar69 * fVar66;
                            auVar110._8_4_ = fVar69 * fVar67;
                            auVar110._12_4_ = fVar69 * fVar68;
                            auVar222._0_4_ = fVar92 * fVar39;
                            auVar222._4_4_ = fVar92 * fVar66;
                            auVar222._8_4_ = fVar92 * fVar67;
                            auVar222._12_4_ = fVar92 * fVar68;
                            auVar235._0_4_ = fVar93 * fVar39;
                            auVar235._4_4_ = fVar93 * fVar66;
                            auVar235._8_4_ = fVar93 * fVar67;
                            auVar235._12_4_ = fVar93 * fVar68;
                            _local_3828 = vfmadd231ps_fma(auVar110,auVar72,auVar185);
                            _local_38e8 = vfmadd231ps_fma(auVar222,auVar72,auVar198);
                            _local_38c8 = vfmadd231ps_fma(auVar235,auVar72,auVar210);
                            uVar28 = (ulong)*(uint *)(lVar33 + 0x20 + uVar35 * 4);
                            uVar26 = *(undefined4 *)(lVar5 + uVar28 * 4);
                            auVar186._4_4_ = uVar26;
                            auVar186._0_4_ = uVar26;
                            auVar186._8_4_ = uVar26;
                            auVar186._12_4_ = uVar26;
                            uVar26 = *(undefined4 *)(lVar5 + 4 + uVar28 * 4);
                            auVar199._4_4_ = uVar26;
                            auVar199._0_4_ = uVar26;
                            auVar199._8_4_ = uVar26;
                            auVar199._12_4_ = uVar26;
                            uVar26 = *(undefined4 *)(lVar5 + 8 + uVar28 * 4);
                            auVar211._4_4_ = uVar26;
                            auVar211._0_4_ = uVar26;
                            auVar211._8_4_ = uVar26;
                            auVar211._12_4_ = uVar26;
                            fVar69 = *(float *)(lVar32 + uVar28 * 4);
                            fVar92 = *(float *)(lVar32 + 4 + uVar28 * 4);
                            fVar93 = *(float *)(lVar32 + 8 + uVar28 * 4);
                            auVar223._0_4_ = fVar69 * fVar39;
                            auVar223._4_4_ = fVar69 * fVar66;
                            auVar223._8_4_ = fVar69 * fVar67;
                            auVar223._12_4_ = fVar69 * fVar68;
                            auVar236._0_4_ = fVar92 * fVar39;
                            auVar236._4_4_ = fVar92 * fVar66;
                            auVar236._8_4_ = fVar92 * fVar67;
                            auVar236._12_4_ = fVar92 * fVar68;
                            auVar245._0_4_ = fVar93 * fVar39;
                            auVar245._4_4_ = fVar93 * fVar66;
                            auVar245._8_4_ = fVar93 * fVar67;
                            auVar245._12_4_ = fVar93 * fVar68;
                            _local_3668 = vfmadd231ps_fma(auVar223,auVar72,auVar186);
                            _local_3678 = vfmadd231ps_fma(auVar236,auVar72,auVar199);
                            _local_3688 = vfmadd231ps_fma(auVar245,auVar72,auVar211);
                            uVar28 = (ulong)*(uint *)(lVar33 + 0x30 + uVar35 * 4);
                            fVar69 = *(float *)(lVar32 + uVar28 * 4);
                            fVar92 = *(float *)(lVar32 + 4 + uVar28 * 4);
                            fVar93 = *(float *)(lVar32 + 8 + uVar28 * 4);
                            auVar224._0_4_ = fVar39 * fVar69;
                            auVar224._4_4_ = fVar66 * fVar69;
                            auVar224._8_4_ = fVar67 * fVar69;
                            auVar224._12_4_ = fVar68 * fVar69;
                            auVar187._0_4_ = fVar39 * fVar92;
                            auVar187._4_4_ = fVar66 * fVar92;
                            auVar187._8_4_ = fVar67 * fVar92;
                            auVar187._12_4_ = fVar68 * fVar92;
                            auVar237._0_4_ = fVar39 * fVar93;
                            auVar237._4_4_ = fVar66 * fVar93;
                            auVar237._8_4_ = fVar67 * fVar93;
                            auVar237._12_4_ = fVar68 * fVar93;
                            uVar26 = *(undefined4 *)(lVar5 + uVar28 * 4);
                            auVar43._4_4_ = uVar26;
                            auVar43._0_4_ = uVar26;
                            auVar43._8_4_ = uVar26;
                            auVar43._12_4_ = uVar26;
                            auVar228 = vfmadd231ps_fma(auVar224,auVar72,auVar43);
                            uVar26 = *(undefined4 *)(lVar5 + 4 + uVar28 * 4);
                            auVar44._4_4_ = uVar26;
                            auVar44._0_4_ = uVar26;
                            auVar44._8_4_ = uVar26;
                            auVar44._12_4_ = uVar26;
                            auVar190 = vfmadd231ps_fma(auVar187,auVar72,auVar44);
                            uVar26 = *(undefined4 *)(lVar5 + 8 + uVar28 * 4);
                            auVar45._4_4_ = uVar26;
                            auVar45._0_4_ = uVar26;
                            auVar45._8_4_ = uVar26;
                            auVar45._12_4_ = uVar26;
                            auVar240 = vfmadd231ps_fma(auVar237,auVar72,auVar45);
                          }
                          else {
                            if (uVar25 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar29 = (ulong)*(uint *)(lVar33 + uVar35 * 4);
                              uVar31 = uVar25;
                              uVar28 = uVar10;
                              do {
                                lVar32 = (long)itime.field_0.i[uVar28] * 0x38;
                                auVar72 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar32) + uVar29 * 4);
                                puVar2 = (undefined4 *)
                                         (*(long *)(lVar5 + 0x38 + lVar32) + uVar29 * 4);
                                uVar12 = *puVar2;
                                uVar13 = puVar2[1];
                                uVar14 = puVar2[2];
                                *(int *)((long)&p0.field_0 + uVar28 * 4) = auVar72._0_4_;
                                uVar26 = vextractps_avx(auVar72,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x10) = uVar26;
                                uVar26 = vextractps_avx(auVar72,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x20) = uVar26;
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4) = uVar12;
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x10) = uVar13;
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x20) = uVar14;
                                uVar31 = uVar31 ^ 1L << (uVar28 & 0x3f);
                                uVar28 = 0;
                                for (uVar11 = uVar31; (uVar11 & 1) == 0;
                                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                                  uVar28 = uVar28 + 1;
                                }
                              } while (uVar31 != 0);
                            }
                            auVar89._8_4_ = 0x3f800000;
                            auVar89._0_8_ = &DAT_3f8000003f800000;
                            auVar89._12_4_ = 0x3f800000;
                            auVar72 = vsubps_avx(auVar89,auVar84);
                            fVar69 = auVar72._0_4_;
                            fVar251 = fVar69 * (float)p0.field_0._0_4_;
                            fVar92 = auVar72._4_4_;
                            fVar256 = fVar92 * (float)p0.field_0._4_4_;
                            fVar93 = auVar72._8_4_;
                            fVar257 = fVar93 * (float)p0.field_0._8_4_;
                            fVar94 = auVar72._12_4_;
                            fVar258 = fVar94 * (float)p0.field_0._12_4_;
                            fVar95 = fVar69 * (float)p0.field_0._16_4_;
                            fVar128 = fVar92 * (float)p0.field_0._20_4_;
                            fVar134 = fVar93 * (float)p0.field_0._24_4_;
                            fVar140 = fVar94 * (float)p0.field_0._28_4_;
                            fVar96 = fVar69 * (float)p0.field_0._32_4_;
                            fVar129 = fVar92 * (float)p0.field_0._36_4_;
                            fVar135 = fVar93 * (float)p0.field_0._40_4_;
                            fVar141 = fVar94 * (float)p0.field_0._44_4_;
                            fVar97 = fVar39 * (float)p1.field_0._0_4_;
                            fVar130 = fVar66 * (float)p1.field_0._4_4_;
                            fVar136 = fVar67 * (float)p1.field_0._8_4_;
                            fVar142 = fVar68 * (float)p1.field_0._12_4_;
                            fVar98 = fVar39 * (float)p1.field_0._16_4_;
                            fVar131 = fVar66 * (float)p1.field_0._20_4_;
                            fVar137 = fVar67 * (float)p1.field_0._24_4_;
                            fVar143 = fVar68 * (float)p1.field_0._28_4_;
                            fVar164 = fVar39 * (float)p1.field_0._32_4_;
                            fVar176 = fVar66 * (float)p1.field_0._36_4_;
                            fVar177 = fVar67 * (float)p1.field_0._40_4_;
                            fVar178 = fVar68 * (float)p1.field_0._44_4_;
                            if (uVar25 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar29 = (ulong)*(uint *)(lVar33 + 0x10 + uVar35 * 4);
                              uVar31 = uVar25;
                              uVar28 = uVar10;
                              do {
                                lVar32 = (long)itime.field_0.i[uVar28] * 0x38;
                                auVar72 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar32) + uVar29 * 4);
                                auVar84 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar32) + uVar29 * 4);
                                *(int *)((long)&p0.field_0 + uVar28 * 4) = auVar72._0_4_;
                                uVar26 = vextractps_avx(auVar72,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x10) = uVar26;
                                uVar26 = vextractps_avx(auVar72,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x20) = uVar26;
                                *(int *)((long)&p1.field_0 + uVar28 * 4) = auVar84._0_4_;
                                uVar26 = vextractps_avx(auVar84,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x10) = uVar26;
                                uVar26 = vextractps_avx(auVar84,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x20) = uVar26;
                                uVar31 = uVar31 ^ 1L << (uVar28 & 0x3f);
                                uVar28 = 0;
                                for (uVar11 = uVar31; (uVar11 & 1) == 0;
                                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                                  uVar28 = uVar28 + 1;
                                }
                              } while (uVar31 != 0);
                            }
                            fVar99 = fVar69 * (float)p0.field_0._0_4_;
                            fVar132 = fVar92 * (float)p0.field_0._4_4_;
                            fVar138 = fVar93 * (float)p0.field_0._8_4_;
                            fVar144 = fVar94 * (float)p0.field_0._12_4_;
                            fVar100 = fVar69 * (float)p0.field_0._16_4_;
                            fVar133 = fVar92 * (float)p0.field_0._20_4_;
                            fVar139 = fVar93 * (float)p0.field_0._24_4_;
                            fVar145 = fVar94 * (float)p0.field_0._28_4_;
                            fVar244 = fVar69 * (float)p0.field_0._32_4_;
                            fVar248 = fVar92 * (float)p0.field_0._36_4_;
                            fVar249 = fVar93 * (float)p0.field_0._40_4_;
                            fVar250 = fVar94 * (float)p0.field_0._44_4_;
                            fVar232 = fVar39 * (float)p1.field_0._0_4_;
                            fVar241 = fVar66 * (float)p1.field_0._4_4_;
                            fVar242 = fVar67 * (float)p1.field_0._8_4_;
                            fVar243 = fVar68 * (float)p1.field_0._12_4_;
                            fVar259 = fVar39 * (float)p1.field_0._16_4_;
                            fVar265 = fVar66 * (float)p1.field_0._20_4_;
                            fVar266 = fVar67 * (float)p1.field_0._24_4_;
                            fVar267 = fVar68 * (float)p1.field_0._28_4_;
                            fVar268 = fVar39 * (float)p1.field_0._32_4_;
                            fVar270 = fVar66 * (float)p1.field_0._36_4_;
                            fVar271 = fVar67 * (float)p1.field_0._40_4_;
                            fVar272 = fVar68 * (float)p1.field_0._44_4_;
                            if (uVar25 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar29 = (ulong)*(uint *)(lVar33 + 0x20 + uVar35 * 4);
                              uVar31 = uVar25;
                              uVar28 = uVar10;
                              do {
                                lVar32 = (long)itime.field_0.i[uVar28] * 0x38;
                                auVar72 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar32) + uVar29 * 4);
                                auVar84 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar32) + uVar29 * 4);
                                *(int *)((long)&p0.field_0 + uVar28 * 4) = auVar72._0_4_;
                                uVar26 = vextractps_avx(auVar72,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x10) = uVar26;
                                uVar26 = vextractps_avx(auVar72,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x20) = uVar26;
                                *(int *)((long)&p1.field_0 + uVar28 * 4) = auVar84._0_4_;
                                uVar26 = vextractps_avx(auVar84,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x10) = uVar26;
                                uVar26 = vextractps_avx(auVar84,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x20) = uVar26;
                                uVar31 = uVar31 ^ 1L << (uVar28 & 0x3f);
                                uVar28 = 0;
                                for (uVar11 = uVar31; (uVar11 & 1) == 0;
                                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                                  uVar28 = uVar28 + 1;
                                }
                              } while (uVar31 != 0);
                            }
                            fVar179 = fVar69 * (float)p0.field_0._0_4_;
                            fVar191 = fVar92 * (float)p0.field_0._4_4_;
                            fVar192 = fVar93 * (float)p0.field_0._8_4_;
                            fVar193 = fVar94 * (float)p0.field_0._12_4_;
                            fVar194 = fVar69 * (float)p0.field_0._16_4_;
                            fVar203 = fVar92 * (float)p0.field_0._20_4_;
                            fVar204 = fVar93 * (float)p0.field_0._24_4_;
                            fVar205 = fVar94 * (float)p0.field_0._28_4_;
                            fVar273 = fVar69 * (float)p0.field_0._32_4_;
                            fVar274 = fVar92 * (float)p0.field_0._36_4_;
                            fVar275 = fVar93 * (float)p0.field_0._40_4_;
                            fVar276 = fVar94 * (float)p0.field_0._44_4_;
                            fVar206 = fVar39 * (float)p1.field_0._0_4_;
                            fVar216 = fVar66 * (float)p1.field_0._4_4_;
                            fVar217 = fVar67 * (float)p1.field_0._8_4_;
                            fVar218 = fVar68 * (float)p1.field_0._12_4_;
                            fVar219 = fVar39 * (float)p1.field_0._16_4_;
                            fVar229 = fVar66 * (float)p1.field_0._20_4_;
                            fVar230 = fVar67 * (float)p1.field_0._24_4_;
                            fVar231 = fVar68 * (float)p1.field_0._28_4_;
                            fVar277 = fVar39 * (float)p1.field_0._32_4_;
                            fVar280 = fVar66 * (float)p1.field_0._36_4_;
                            fVar281 = fVar67 * (float)p1.field_0._40_4_;
                            fVar282 = fVar68 * (float)p1.field_0._44_4_;
                            if (uVar25 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar29 = (ulong)*(uint *)(lVar33 + 0x30 + uVar35 * 4);
                              uVar31 = uVar25;
                              uVar28 = uVar10;
                              do {
                                lVar32 = (long)itime.field_0.i[uVar28] * 0x38;
                                auVar72 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar32) + uVar29 * 4);
                                auVar84 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + 0x38 + lVar32) + uVar29 * 4);
                                *(int *)((long)&p0.field_0 + uVar28 * 4) = auVar72._0_4_;
                                uVar26 = vextractps_avx(auVar72,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x10) = uVar26;
                                uVar26 = vextractps_avx(auVar72,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar28 * 4 + 0x20) = uVar26;
                                *(int *)((long)&p1.field_0 + uVar28 * 4) = auVar84._0_4_;
                                uVar26 = vextractps_avx(auVar84,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x10) = uVar26;
                                uVar26 = vextractps_avx(auVar84,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar28 * 4 + 0x20) = uVar26;
                                uVar31 = uVar31 ^ 1L << (uVar28 & 0x3f);
                                uVar28 = 0;
                                for (uVar11 = uVar31; (uVar11 & 1) == 0;
                                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                                  uVar28 = uVar28 + 1;
                                }
                              } while (uVar31 != 0);
                            }
                            auVar255._0_4_ = fVar251 + fVar97;
                            auVar255._4_4_ = fVar256 + fVar130;
                            auVar255._8_4_ = fVar257 + fVar136;
                            auVar255._12_4_ = fVar258 + fVar142;
                            auVar163._0_4_ = fVar98 + fVar95;
                            auVar163._4_4_ = fVar131 + fVar128;
                            auVar163._8_4_ = fVar137 + fVar134;
                            auVar163._12_4_ = fVar143 + fVar140;
                            auVar175._0_4_ = fVar164 + fVar96;
                            auVar175._4_4_ = fVar176 + fVar129;
                            auVar175._8_4_ = fVar177 + fVar135;
                            auVar175._12_4_ = fVar178 + fVar141;
                            local_3828._4_4_ = fVar241 + fVar132;
                            local_3828._0_4_ = fVar232 + fVar99;
                            fStack_3820 = fVar242 + fVar138;
                            fStack_381c = fVar243 + fVar144;
                            local_38e8._4_4_ = fVar265 + fVar133;
                            local_38e8._0_4_ = fVar259 + fVar100;
                            fStack_38e0 = fVar266 + fVar139;
                            fStack_38dc = fVar267 + fVar145;
                            local_38c8._4_4_ = fVar248 + fVar270;
                            local_38c8._0_4_ = fVar244 + fVar268;
                            fStack_38c0 = fVar249 + fVar271;
                            fStack_38bc = fVar250 + fVar272;
                            local_3668._4_4_ = fVar191 + fVar216;
                            local_3668._0_4_ = fVar179 + fVar206;
                            fStack_3660 = fVar192 + fVar217;
                            fStack_365c = fVar193 + fVar218;
                            local_3678._4_4_ = fVar229 + fVar203;
                            local_3678._0_4_ = fVar219 + fVar194;
                            fStack_3670 = fVar230 + fVar204;
                            fStack_366c = fVar231 + fVar205;
                            local_3688._4_4_ = fVar274 + fVar280;
                            local_3688._0_4_ = fVar273 + fVar277;
                            fStack_3680 = fVar275 + fVar281;
                            fStack_367c = fVar276 + fVar282;
                            auVar228._0_4_ =
                                 fVar69 * (float)p0.field_0._0_4_ + fVar39 * (float)p1.field_0._0_4_
                            ;
                            auVar228._4_4_ =
                                 fVar92 * (float)p0.field_0._4_4_ + fVar66 * (float)p1.field_0._4_4_
                            ;
                            auVar228._8_4_ =
                                 fVar93 * (float)p0.field_0._8_4_ + fVar67 * (float)p1.field_0._8_4_
                            ;
                            auVar228._12_4_ =
                                 fVar94 * (float)p0.field_0._12_4_ +
                                 fVar68 * (float)p1.field_0._12_4_;
                            auVar190._0_4_ =
                                 fVar69 * (float)p0.field_0._16_4_ +
                                 fVar39 * (float)p1.field_0._16_4_;
                            auVar190._4_4_ =
                                 fVar92 * (float)p0.field_0._20_4_ +
                                 fVar66 * (float)p1.field_0._20_4_;
                            auVar190._8_4_ =
                                 fVar93 * (float)p0.field_0._24_4_ +
                                 fVar67 * (float)p1.field_0._24_4_;
                            auVar190._12_4_ =
                                 fVar94 * (float)p0.field_0._28_4_ +
                                 fVar68 * (float)p1.field_0._28_4_;
                            auVar240._0_4_ =
                                 fVar69 * (float)p0.field_0._32_4_ +
                                 fVar39 * (float)p1.field_0._32_4_;
                            auVar240._4_4_ =
                                 fVar92 * (float)p0.field_0._36_4_ +
                                 fVar66 * (float)p1.field_0._36_4_;
                            auVar240._8_4_ =
                                 fVar93 * (float)p0.field_0._40_4_ +
                                 fVar67 * (float)p1.field_0._40_4_;
                            auVar240._12_4_ =
                                 fVar94 * (float)p0.field_0._44_4_ +
                                 fVar68 * (float)p1.field_0._44_4_;
                          }
                          auVar72 = *(undefined1 (*) [16])ray;
                          auVar84 = *(undefined1 (*) [16])(ray + 0x10);
                          auVar70 = *(undefined1 (*) [16])(ray + 0x20);
                          auVar85 = vsubps_avx(auVar255,auVar72);
                          auVar180 = vsubps_avx(auVar163,auVar84);
                          auVar233 = vsubps_avx(auVar175,auVar70);
                          auVar234 = vsubps_avx(auVar228,auVar72);
                          auVar260 = vsubps_avx(auVar190,auVar84);
                          auVar40 = vsubps_avx(auVar240,auVar70);
                          auVar41 = vsubps_avx(auVar234,auVar85);
                          auVar42 = vsubps_avx(auVar260,auVar180);
                          auVar108 = vsubps_avx(auVar40,auVar233);
                          auVar150._0_4_ = auVar234._0_4_ + auVar85._0_4_;
                          auVar150._4_4_ = auVar234._4_4_ + auVar85._4_4_;
                          auVar150._8_4_ = auVar234._8_4_ + auVar85._8_4_;
                          auVar150._12_4_ = auVar234._12_4_ + auVar85._12_4_;
                          auVar170._0_4_ = auVar260._0_4_ + auVar180._0_4_;
                          auVar170._4_4_ = auVar260._4_4_ + auVar180._4_4_;
                          auVar170._8_4_ = auVar260._8_4_ + auVar180._8_4_;
                          auVar170._12_4_ = auVar260._12_4_ + auVar180._12_4_;
                          fVar39 = auVar233._0_4_;
                          auVar238._0_4_ = auVar40._0_4_ + fVar39;
                          fVar66 = auVar233._4_4_;
                          auVar238._4_4_ = auVar40._4_4_ + fVar66;
                          fVar67 = auVar233._8_4_;
                          auVar238._8_4_ = auVar40._8_4_ + fVar67;
                          fVar68 = auVar233._12_4_;
                          auVar238._12_4_ = auVar40._12_4_ + fVar68;
                          auVar278._0_4_ = auVar170._0_4_ * auVar108._0_4_;
                          auVar278._4_4_ = auVar170._4_4_ * auVar108._4_4_;
                          auVar278._8_4_ = auVar170._8_4_ * auVar108._8_4_;
                          auVar278._12_4_ = auVar170._12_4_ * auVar108._12_4_;
                          auVar89 = vfmsub231ps_fma(auVar278,auVar42,auVar238);
                          auVar254._0_4_ = auVar238._0_4_ * auVar41._0_4_;
                          auVar254._4_4_ = auVar238._4_4_ * auVar41._4_4_;
                          auVar254._8_4_ = auVar238._8_4_ * auVar41._8_4_;
                          auVar254._12_4_ = auVar238._12_4_ * auVar41._12_4_;
                          auVar155 = vfmsub231ps_fma(auVar254,auVar108,auVar150);
                          auVar46._0_4_ = auVar150._0_4_ * auVar42._0_4_;
                          auVar46._4_4_ = auVar150._4_4_ * auVar42._4_4_;
                          auVar46._8_4_ = auVar150._8_4_ * auVar42._8_4_;
                          auVar46._12_4_ = auVar150._12_4_ * auVar42._12_4_;
                          auVar54 = vfmsub231ps_fma(auVar46,auVar41,auVar170);
                          fVar128 = *(float *)(ray + 0x60);
                          fVar129 = *(float *)(ray + 100);
                          fVar130 = *(float *)(ray + 0x68);
                          auVar19 = *(undefined1 (*) [12])(ray + 0x60);
                          fVar131 = *(float *)(ray + 0x6c);
                          auVar239._0_4_ = fVar128 * auVar54._0_4_;
                          auVar239._4_4_ = fVar129 * auVar54._4_4_;
                          auVar239._8_4_ = fVar130 * auVar54._8_4_;
                          auVar239._12_4_ = fVar131 * auVar54._12_4_;
                          auVar54 = *(undefined1 (*) [16])(ray + 0x50);
                          auVar109 = vfmadd231ps_fma(auVar239,auVar54,auVar155);
                          auVar155 = *(undefined1 (*) [16])(ray + 0x40);
                          auVar163 = vfmadd231ps_fma(auVar109,auVar155,auVar89);
                          auVar72 = vsubps_avx(_local_3828,auVar72);
                          auVar84 = vsubps_avx(_local_38e8,auVar84);
                          auVar70 = vsubps_avx(_local_38c8,auVar70);
                          auVar109 = vsubps_avx(auVar180,auVar84);
                          auVar233 = vsubps_avx(auVar233,auVar70);
                          auVar171._0_4_ = auVar180._0_4_ + auVar84._0_4_;
                          auVar171._4_4_ = auVar180._4_4_ + auVar84._4_4_;
                          auVar171._8_4_ = auVar180._8_4_ + auVar84._8_4_;
                          auVar171._12_4_ = auVar180._12_4_ + auVar84._12_4_;
                          auVar261._0_4_ = fVar39 + auVar70._0_4_;
                          auVar261._4_4_ = fVar66 + auVar70._4_4_;
                          auVar261._8_4_ = fVar67 + auVar70._8_4_;
                          auVar261._12_4_ = fVar68 + auVar70._12_4_;
                          fVar134 = auVar233._0_4_;
                          auVar111._0_4_ = fVar134 * auVar171._0_4_;
                          fVar135 = auVar233._4_4_;
                          auVar111._4_4_ = fVar135 * auVar171._4_4_;
                          fVar136 = auVar233._8_4_;
                          auVar111._8_4_ = fVar136 * auVar171._8_4_;
                          fVar137 = auVar233._12_4_;
                          auVar111._12_4_ = fVar137 * auVar171._12_4_;
                          auVar175 = vfmsub231ps_fma(auVar111,auVar109,auVar261);
                          auVar89 = vsubps_avx(auVar85,auVar72);
                          fVar69 = auVar89._0_4_;
                          auVar262._0_4_ = auVar261._0_4_ * fVar69;
                          fVar93 = auVar89._4_4_;
                          auVar262._4_4_ = auVar261._4_4_ * fVar93;
                          fVar95 = auVar89._8_4_;
                          auVar262._8_4_ = auVar261._8_4_ * fVar95;
                          fVar97 = auVar89._12_4_;
                          auVar262._12_4_ = auVar261._12_4_ * fVar97;
                          auVar200._0_4_ = auVar85._0_4_ + auVar72._0_4_;
                          auVar200._4_4_ = auVar85._4_4_ + auVar72._4_4_;
                          auVar200._8_4_ = auVar85._8_4_ + auVar72._8_4_;
                          auVar200._12_4_ = auVar85._12_4_ + auVar72._12_4_;
                          auVar255 = vfmsub231ps_fma(auVar262,auVar233,auVar200);
                          fVar92 = auVar109._0_4_;
                          auVar201._0_4_ = auVar200._0_4_ * fVar92;
                          fVar94 = auVar109._4_4_;
                          auVar201._4_4_ = auVar200._4_4_ * fVar94;
                          fVar96 = auVar109._8_4_;
                          auVar201._8_4_ = auVar200._8_4_ * fVar96;
                          fVar98 = auVar109._12_4_;
                          auVar201._12_4_ = auVar200._12_4_ * fVar98;
                          auVar43 = vfmsub231ps_fma(auVar201,auVar89,auVar171);
                          auVar172._0_4_ = fVar128 * auVar43._0_4_;
                          auVar172._4_4_ = fVar129 * auVar43._4_4_;
                          auVar172._8_4_ = fVar130 * auVar43._8_4_;
                          auVar172._12_4_ = fVar131 * auVar43._12_4_;
                          auVar255 = vfmadd231ps_fma(auVar172,auVar54,auVar255);
                          auVar175 = vfmadd231ps_fma(auVar255,auVar155,auVar175);
                          auVar255 = vsubps_avx(auVar72,auVar234);
                          auVar47._0_4_ = auVar234._0_4_ + auVar72._0_4_;
                          auVar47._4_4_ = auVar234._4_4_ + auVar72._4_4_;
                          auVar47._8_4_ = auVar234._8_4_ + auVar72._8_4_;
                          auVar47._12_4_ = auVar234._12_4_ + auVar72._12_4_;
                          auVar234 = vsubps_avx(auVar84,auVar260);
                          auVar112._0_4_ = auVar260._0_4_ + auVar84._0_4_;
                          auVar112._4_4_ = auVar260._4_4_ + auVar84._4_4_;
                          auVar112._8_4_ = auVar260._8_4_ + auVar84._8_4_;
                          auVar112._12_4_ = auVar260._12_4_ + auVar84._12_4_;
                          auVar260 = vsubps_avx(auVar70,auVar40);
                          auVar75._0_4_ = auVar70._0_4_ + auVar40._0_4_;
                          auVar75._4_4_ = auVar70._4_4_ + auVar40._4_4_;
                          auVar75._8_4_ = auVar70._8_4_ + auVar40._8_4_;
                          auVar75._12_4_ = auVar70._12_4_ + auVar40._12_4_;
                          auVar151._0_4_ = auVar260._0_4_ * auVar112._0_4_;
                          auVar151._4_4_ = auVar260._4_4_ * auVar112._4_4_;
                          auVar151._8_4_ = auVar260._8_4_ * auVar112._8_4_;
                          auVar151._12_4_ = auVar260._12_4_ * auVar112._12_4_;
                          auVar84 = vfmsub231ps_fma(auVar151,auVar234,auVar75);
                          auVar76._0_4_ = auVar255._0_4_ * auVar75._0_4_;
                          auVar76._4_4_ = auVar255._4_4_ * auVar75._4_4_;
                          auVar76._8_4_ = auVar255._8_4_ * auVar75._8_4_;
                          auVar76._12_4_ = auVar255._12_4_ * auVar75._12_4_;
                          auVar72 = vfmsub231ps_fma(auVar76,auVar260,auVar47);
                          auVar48._0_4_ = auVar234._0_4_ * auVar47._0_4_;
                          auVar48._4_4_ = auVar234._4_4_ * auVar47._4_4_;
                          auVar48._8_4_ = auVar234._8_4_ * auVar47._8_4_;
                          auVar48._12_4_ = auVar234._12_4_ * auVar47._12_4_;
                          auVar70 = vfmsub231ps_fma(auVar48,auVar255,auVar112);
                          auVar49._0_4_ = fVar128 * auVar70._0_4_;
                          auVar49._4_4_ = fVar129 * auVar70._4_4_;
                          auVar49._8_4_ = fVar130 * auVar70._8_4_;
                          auVar49._12_4_ = fVar131 * auVar70._12_4_;
                          auVar72 = vfmadd231ps_fma(auVar49,auVar54,auVar72);
                          auVar40 = vfmadd231ps_fma(auVar72,auVar155,auVar84);
                          auVar188._0_4_ = auVar40._0_4_ + auVar163._0_4_ + auVar175._0_4_;
                          auVar188._4_4_ = auVar40._4_4_ + auVar163._4_4_ + auVar175._4_4_;
                          auVar188._8_4_ = auVar40._8_4_ + auVar163._8_4_ + auVar175._8_4_;
                          auVar188._12_4_ = auVar40._12_4_ + auVar163._12_4_ + auVar175._12_4_;
                          auVar72 = vminps_avx(auVar163,auVar175);
                          auVar84 = vminps_avx(auVar72,auVar40);
                          auVar72 = vandps_avx(auVar252,auVar188);
                          auVar113._0_4_ = auVar72._0_4_ * 1.1920929e-07;
                          auVar113._4_4_ = auVar72._4_4_ * 1.1920929e-07;
                          auVar113._8_4_ = auVar72._8_4_ * 1.1920929e-07;
                          auVar113._12_4_ = auVar72._12_4_ * 1.1920929e-07;
                          uVar28 = CONCAT44(auVar113._4_4_,auVar113._0_4_);
                          auVar152._0_8_ = uVar28 ^ 0x8000000080000000;
                          auVar152._8_4_ = -auVar113._8_4_;
                          auVar152._12_4_ = -auVar113._12_4_;
                          auVar84 = vcmpps_avx(auVar84,auVar152,5);
                          auVar70 = vmaxps_avx(auVar163,auVar175);
                          auVar70 = vmaxps_avx(auVar70,auVar40);
                          auVar70 = vcmpps_avx(auVar70,auVar113,2);
                          auVar84 = vorps_avx(auVar84,auVar70);
                          auVar70 = auVar127 & auVar84;
                          if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar70 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar70[0xf]) {
                            auVar91 = ZEXT1664(auVar127);
                          }
                          else {
                            auVar50._0_4_ = fVar92 * auVar108._0_4_;
                            auVar50._4_4_ = fVar94 * auVar108._4_4_;
                            auVar50._8_4_ = fVar96 * auVar108._8_4_;
                            auVar50._12_4_ = fVar98 * auVar108._12_4_;
                            auVar77._0_4_ = auVar42._0_4_ * fVar69;
                            auVar77._4_4_ = auVar42._4_4_ * fVar93;
                            auVar77._8_4_ = auVar42._8_4_ * fVar95;
                            auVar77._12_4_ = auVar42._12_4_ * fVar97;
                            auVar40 = vfmsub213ps_fma(auVar42,auVar233,auVar50);
                            auVar114._0_4_ = auVar234._0_4_ * fVar134;
                            auVar114._4_4_ = auVar234._4_4_ * fVar135;
                            auVar114._8_4_ = auVar234._8_4_ * fVar136;
                            auVar114._12_4_ = auVar234._12_4_ * fVar137;
                            auVar153._0_4_ = auVar260._0_4_ * fVar69;
                            auVar153._4_4_ = auVar260._4_4_ * fVar93;
                            auVar153._8_4_ = auVar260._8_4_ * fVar95;
                            auVar153._12_4_ = auVar260._12_4_ * fVar97;
                            auVar42 = vfmsub213ps_fma(auVar260,auVar109,auVar114);
                            auVar70 = vandps_avx(auVar252,auVar50);
                            auVar260 = vandps_avx(auVar252,auVar114);
                            auVar70 = vcmpps_avx(auVar70,auVar260,1);
                            vVar8.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vblendvps_avx(auVar42,auVar40,auVar70);
                            auVar51._0_4_ = auVar255._0_4_ * fVar92;
                            auVar51._4_4_ = auVar255._4_4_ * fVar94;
                            auVar51._8_4_ = auVar255._8_4_ * fVar96;
                            auVar51._12_4_ = auVar255._12_4_ * fVar98;
                            auVar260 = vfmsub213ps_fma(auVar255,auVar233,auVar153);
                            auVar115._0_4_ = auVar41._0_4_ * fVar134;
                            auVar115._4_4_ = auVar41._4_4_ * fVar135;
                            auVar115._8_4_ = auVar41._8_4_ * fVar136;
                            auVar115._12_4_ = auVar41._12_4_ * fVar137;
                            auVar40 = vfmsub213ps_fma(auVar108,auVar89,auVar115);
                            auVar70 = vandps_avx(auVar252,auVar115);
                            auVar233 = vandps_avx(auVar252,auVar153);
                            auVar70 = vcmpps_avx(auVar70,auVar233,1);
                            vVar9.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vblendvps_avx(auVar260,auVar40,auVar70);
                            auVar260 = vfmsub213ps_fma(auVar41,auVar109,auVar77);
                            auVar234 = vfmsub213ps_fma(auVar234,auVar89,auVar51);
                            auVar70 = vandps_avx(auVar252,auVar77);
                            auVar233 = vandps_avx(auVar252,auVar51);
                            auVar70 = vcmpps_avx(auVar70,auVar233,1);
                            auVar233 = vblendvps_avx(auVar234,auVar260,auVar70);
                            local_36f8 = auVar19._0_4_;
                            fStack_36f4 = auVar19._4_4_;
                            fStack_36f0 = auVar19._8_4_;
                            auVar52._0_4_ = auVar233._0_4_ * local_36f8;
                            auVar52._4_4_ = auVar233._4_4_ * fStack_36f4;
                            auVar52._8_4_ = auVar233._8_4_ * fStack_36f0;
                            auVar52._12_4_ = auVar233._12_4_ * fVar131;
                            auVar70 = vfmadd213ps_fma(auVar54,(undefined1  [16])vVar9.field_0,
                                                      auVar52);
                            auVar70 = vfmadd213ps_fma(auVar155,(undefined1  [16])vVar8.field_0,
                                                      auVar70);
                            auVar53._0_4_ = auVar70._0_4_ + auVar70._0_4_;
                            auVar53._4_4_ = auVar70._4_4_ + auVar70._4_4_;
                            auVar53._8_4_ = auVar70._8_4_ + auVar70._8_4_;
                            auVar53._12_4_ = auVar70._12_4_ + auVar70._12_4_;
                            auVar78._0_4_ = auVar233._0_4_ * fVar39;
                            auVar78._4_4_ = auVar233._4_4_ * fVar66;
                            auVar78._8_4_ = auVar233._8_4_ * fVar67;
                            auVar78._12_4_ = auVar233._12_4_ * fVar68;
                            auVar70 = vfmadd213ps_fma(auVar180,(undefined1  [16])vVar9.field_0,
                                                      auVar78);
                            auVar54 = vfmadd213ps_fma(auVar85,(undefined1  [16])vVar8.field_0,
                                                      auVar70);
                            auVar70 = vrcpps_avx(auVar53);
                            auVar212._8_4_ = 0x3f800000;
                            auVar212._0_8_ = &DAT_3f8000003f800000;
                            auVar212._12_4_ = 0x3f800000;
                            auVar155 = vfnmadd213ps_fma(auVar70,auVar53,auVar212);
                            auVar70 = vfmadd132ps_fma(auVar155,auVar70,auVar70);
                            auVar79._0_4_ = (auVar54._0_4_ + auVar54._0_4_) * auVar70._0_4_;
                            auVar79._4_4_ = (auVar54._4_4_ + auVar54._4_4_) * auVar70._4_4_;
                            auVar79._8_4_ = (auVar54._8_4_ + auVar54._8_4_) * auVar70._8_4_;
                            auVar79._12_4_ = (auVar54._12_4_ + auVar54._12_4_) * auVar70._12_4_;
                            auVar70 = *(undefined1 (*) [16])(ray + 0x80);
                            auVar54 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar79,2);
                            auVar155 = vcmpps_avx(auVar79,auVar70,2);
                            auVar54 = vandps_avx(auVar54,auVar155);
                            uVar28 = CONCAT44(auVar53._4_4_,auVar53._0_4_);
                            auVar154._0_8_ = uVar28 ^ 0x8000000080000000;
                            auVar154._8_4_ = -auVar53._8_4_;
                            auVar154._12_4_ = -auVar53._12_4_;
                            auVar155 = vcmpps_avx(auVar53,auVar154,4);
                            auVar54 = vandps_avx(auVar155,auVar54);
                            auVar84 = vandps_avx(auVar127,auVar84);
                            auVar54 = vpslld_avx(auVar54,0x1f);
                            auVar155 = vpsrad_avx(auVar54,0x1f);
                            auVar54 = auVar84 & auVar155;
                            auVar91 = ZEXT1664(auVar127);
                            if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar54 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || auVar54[0xf] < '\0') {
                              auVar84 = vandps_avx(auVar155,auVar84);
                              uVar22 = pGVar4->mask;
                              auVar55._4_4_ = uVar22;
                              auVar55._0_4_ = uVar22;
                              auVar55._8_4_ = uVar22;
                              auVar55._12_4_ = uVar22;
                              auVar54 = vpand_avx(auVar55,*(undefined1 (*) [16])(ray + 0x90));
                              auVar54 = vpcmpeqd_avx(auVar54,_DAT_01feba10);
                              auVar155 = auVar84 & ~auVar54;
                              if ((((auVar155 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar155 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar155 >> 0x5f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) || auVar155[0xf] < '\0') {
                                aVar64 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                         vandnps_avx(auVar54,auVar84);
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar84 = vrcpps_avx(auVar188);
                                  auVar215._8_4_ = 0x3f800000;
                                  auVar215._0_8_ = &DAT_3f8000003f800000;
                                  auVar215._12_4_ = 0x3f800000;
                                  auVar54 = vfnmadd213ps_fma(auVar188,auVar84,auVar215);
                                  auVar84 = vfmadd132ps_fma(auVar54,auVar84,auVar84);
                                  auVar62._8_4_ = 0x219392ef;
                                  auVar62._0_8_ = 0x219392ef219392ef;
                                  auVar62._12_4_ = 0x219392ef;
                                  auVar72 = vcmpps_avx(auVar72,auVar62,5);
                                  auVar72 = vandps_avx(auVar72,auVar84);
                                  auVar161._0_4_ = auVar72._0_4_ * auVar163._0_4_;
                                  auVar161._4_4_ = auVar72._4_4_ * auVar163._4_4_;
                                  auVar161._8_4_ = auVar72._8_4_ * auVar163._8_4_;
                                  auVar161._12_4_ = auVar72._12_4_ * auVar163._12_4_;
                                  auVar84 = vminps_avx(auVar161,auVar215);
                                  auVar63._0_4_ = auVar175._0_4_ * auVar72._0_4_;
                                  auVar63._4_4_ = auVar175._4_4_ * auVar72._4_4_;
                                  auVar63._8_4_ = auVar175._8_4_ * auVar72._8_4_;
                                  auVar63._12_4_ = auVar175._12_4_ * auVar72._12_4_;
                                  auVar72 = vminps_avx(auVar63,auVar215);
                                  auVar54 = vsubps_avx(auVar215,auVar84);
                                  auVar155 = vsubps_avx(auVar215,auVar72);
                                  auVar18._8_8_ = uVar21;
                                  auVar18._0_8_ = uVar20;
                                  vblendvps_avx(auVar84,auVar54,auVar18);
                                  auVar72 = vblendvps_avx(auVar72,auVar155,auVar18);
                                  p0.field_0.field_0.x.field_0 =
                                       (vfloat_impl<4>)(vfloat_impl<4>)vVar8.field_0;
                                  p0.field_0.field_0.y.field_0 =
                                       (vfloat_impl<4>)(vfloat_impl<4>)vVar9.field_0;
                                  p0.field_0._32_16_ = auVar233;
                                  vpcmpeqd_avx2(ZEXT1632(auVar72),ZEXT1632(auVar72));
                                  auVar72 = vblendvps_avx(auVar70,auVar79,(undefined1  [16])aVar64);
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar72;
                                  itime.field_0 = aVar64;
                                  p1.field_0._0_8_ = &itime;
                                  p1.field_0._8_8_ = pGVar4->userPtr;
                                  p1.field_0._16_8_ = context->user;
                                  p1.field_0._24_8_ = ray;
                                  p1.field_0._32_8_ = &p0;
                                  p1.field_0._40_4_ = 4;
                                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    (*pGVar4->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                  }
                                  if (itime.field_0 ==
                                      (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                    auVar72 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                                    auVar72 = auVar72 ^ _DAT_01febe20;
                                  }
                                  else {
                                    p_Var6 = context->args->filter;
                                    auVar72 = vpcmpeqd_avx((undefined1  [16])itime.field_0,
                                                           (undefined1  [16])itime.field_0);
                                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                      auVar279._0_8_ = (*p_Var6)((RTCFilterFunctionNArguments *)&p1)
                                      ;
                                      auVar279._8_56_ = extraout_var;
                                      auVar72 = vpcmpeqd_avx(auVar279._0_16_,auVar279._0_16_);
                                    }
                                    auVar84 = vpcmpeqd_avx(ZEXT816(0) << 0x40,
                                                           (undefined1  [16])itime.field_0);
                                    auVar72 = auVar84 ^ auVar72;
                                    auVar124._8_4_ = 0xff800000;
                                    auVar124._0_8_ = 0xff800000ff800000;
                                    auVar124._12_4_ = 0xff800000;
                                    auVar84 = vblendvps_avx(auVar124,*(undefined1 (*) [16])
                                                                      (p1.field_0._24_8_ + 0x80),
                                                            auVar84);
                                    *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar84;
                                  }
                                  auVar72 = vpslld_avx(auVar72,0x1f);
                                  aVar64 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                           vpsrad_avx(auVar72,0x1f);
                                  auVar72 = vblendvps_avx(auVar70,*(undefined1 (*) [16])pRVar1,
                                                          auVar72);
                                  *(undefined1 (*) [16])pRVar1 = auVar72;
                                }
                                auVar127 = vpandn_avx((undefined1  [16])aVar64,auVar127);
                                auVar91 = ZEXT1664(auVar127);
                              }
                            }
                          }
                          auVar127 = auVar91._0_16_;
                          if ((((auVar127 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar127 >> 0x3f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                              (auVar127 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && -1 < auVar91[0xf]) {
                            bVar38 = false;
                            auVar279 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                          CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                          }
                          else {
                            auVar72 = *(undefined1 (*) [16])ray;
                            auVar84 = *(undefined1 (*) [16])(ray + 0x10);
                            auVar70 = *(undefined1 (*) [16])(ray + 0x20);
                            auVar85 = vsubps_avx(_local_3668,auVar72);
                            auVar180 = vsubps_avx(_local_3678,auVar84);
                            auVar54 = vsubps_avx(_local_3688,auVar70);
                            auVar155 = vsubps_avx(auVar228,auVar72);
                            auVar233 = vsubps_avx(auVar190,auVar84);
                            auVar234 = vsubps_avx(auVar240,auVar70);
                            auVar260 = vsubps_avx(_local_3828,auVar72);
                            auVar40 = vsubps_avx(_local_38e8,auVar84);
                            auVar70 = vsubps_avx(_local_38c8,auVar70);
                            auVar41 = vsubps_avx(auVar260,auVar85);
                            auVar42 = vsubps_avx(auVar40,auVar180);
                            auVar108 = vsubps_avx(auVar70,auVar54);
                            auVar225._0_4_ = auVar260._0_4_ + auVar85._0_4_;
                            auVar225._4_4_ = auVar260._4_4_ + auVar85._4_4_;
                            auVar225._8_4_ = auVar260._8_4_ + auVar85._8_4_;
                            auVar225._12_4_ = auVar260._12_4_ + auVar85._12_4_;
                            auVar246._0_4_ = auVar180._0_4_ + auVar40._0_4_;
                            auVar246._4_4_ = auVar180._4_4_ + auVar40._4_4_;
                            auVar246._8_4_ = auVar180._8_4_ + auVar40._8_4_;
                            auVar246._12_4_ = auVar180._12_4_ + auVar40._12_4_;
                            fVar39 = auVar54._0_4_;
                            auVar263._0_4_ = auVar70._0_4_ + fVar39;
                            fVar66 = auVar54._4_4_;
                            auVar263._4_4_ = auVar70._4_4_ + fVar66;
                            fVar67 = auVar54._8_4_;
                            auVar263._8_4_ = auVar70._8_4_ + fVar67;
                            fVar68 = auVar54._12_4_;
                            auVar263._12_4_ = auVar70._12_4_ + fVar68;
                            auVar269._0_4_ = auVar246._0_4_ * auVar108._0_4_;
                            auVar269._4_4_ = auVar246._4_4_ * auVar108._4_4_;
                            auVar269._8_4_ = auVar246._8_4_ * auVar108._8_4_;
                            auVar269._12_4_ = auVar246._12_4_ * auVar108._12_4_;
                            auVar89 = vfmsub231ps_fma(auVar269,auVar42,auVar263);
                            auVar264._0_4_ = auVar263._0_4_ * auVar41._0_4_;
                            auVar264._4_4_ = auVar263._4_4_ * auVar41._4_4_;
                            auVar264._8_4_ = auVar263._8_4_ * auVar41._8_4_;
                            auVar264._12_4_ = auVar263._12_4_ * auVar41._12_4_;
                            auVar84 = vfmsub231ps_fma(auVar264,auVar108,auVar225);
                            auVar226._0_4_ = auVar225._0_4_ * auVar42._0_4_;
                            auVar226._4_4_ = auVar225._4_4_ * auVar42._4_4_;
                            auVar226._8_4_ = auVar225._8_4_ * auVar42._8_4_;
                            auVar226._12_4_ = auVar225._12_4_ * auVar42._12_4_;
                            auVar72 = vfmsub231ps_fma(auVar226,auVar41,auVar246);
                            fVar128 = *(float *)(ray + 0x60);
                            fVar129 = *(float *)(ray + 100);
                            fVar130 = *(float *)(ray + 0x68);
                            auVar19 = *(undefined1 (*) [12])(ray + 0x60);
                            fVar131 = *(float *)(ray + 0x6c);
                            auVar247._0_4_ = auVar72._0_4_ * fVar128;
                            auVar247._4_4_ = auVar72._4_4_ * fVar129;
                            auVar247._8_4_ = auVar72._8_4_ * fVar130;
                            auVar247._12_4_ = auVar72._12_4_ * fVar131;
                            auVar72 = *(undefined1 (*) [16])(ray + 0x50);
                            auVar109 = vfmadd231ps_fma(auVar247,auVar72,auVar84);
                            auVar84 = *(undefined1 (*) [16])(ray + 0x40);
                            auVar175 = vfmadd231ps_fma(auVar109,auVar84,auVar89);
                            auVar109 = vsubps_avx(auVar180,auVar233);
                            auVar89 = vsubps_avx(auVar54,auVar234);
                            auVar227._0_4_ = auVar180._0_4_ + auVar233._0_4_;
                            auVar227._4_4_ = auVar180._4_4_ + auVar233._4_4_;
                            auVar227._8_4_ = auVar180._8_4_ + auVar233._8_4_;
                            auVar227._12_4_ = auVar180._12_4_ + auVar233._12_4_;
                            auVar116._0_4_ = auVar234._0_4_ + fVar39;
                            auVar116._4_4_ = auVar234._4_4_ + fVar66;
                            auVar116._8_4_ = auVar234._8_4_ + fVar67;
                            auVar116._12_4_ = auVar234._12_4_ + fVar68;
                            fVar69 = auVar89._0_4_;
                            auVar156._0_4_ = auVar227._0_4_ * fVar69;
                            fVar93 = auVar89._4_4_;
                            auVar156._4_4_ = auVar227._4_4_ * fVar93;
                            fVar95 = auVar89._8_4_;
                            auVar156._8_4_ = auVar227._8_4_ * fVar95;
                            fVar97 = auVar89._12_4_;
                            auVar156._12_4_ = auVar227._12_4_ * fVar97;
                            auVar163 = vfmsub231ps_fma(auVar156,auVar109,auVar116);
                            auVar255 = vsubps_avx(auVar85,auVar155);
                            fVar134 = auVar255._0_4_;
                            auVar117._0_4_ = fVar134 * auVar116._0_4_;
                            fVar135 = auVar255._4_4_;
                            auVar117._4_4_ = fVar135 * auVar116._4_4_;
                            fVar136 = auVar255._8_4_;
                            auVar117._8_4_ = fVar136 * auVar116._8_4_;
                            fVar137 = auVar255._12_4_;
                            auVar117._12_4_ = fVar137 * auVar116._12_4_;
                            auVar213._0_4_ = auVar85._0_4_ + auVar155._0_4_;
                            auVar213._4_4_ = auVar85._4_4_ + auVar155._4_4_;
                            auVar213._8_4_ = auVar85._8_4_ + auVar155._8_4_;
                            auVar213._12_4_ = auVar85._12_4_ + auVar155._12_4_;
                            auVar54 = vfmsub231ps_fma(auVar117,auVar89,auVar213);
                            fVar92 = auVar109._0_4_;
                            auVar214._0_4_ = auVar213._0_4_ * fVar92;
                            fVar94 = auVar109._4_4_;
                            auVar214._4_4_ = auVar213._4_4_ * fVar94;
                            fVar96 = auVar109._8_4_;
                            auVar214._8_4_ = auVar213._8_4_ * fVar96;
                            fVar98 = auVar109._12_4_;
                            auVar214._12_4_ = auVar213._12_4_ * fVar98;
                            auVar228 = vfmsub231ps_fma(auVar214,auVar255,auVar227);
                            auVar189._0_4_ = fVar128 * auVar228._0_4_;
                            auVar189._4_4_ = fVar129 * auVar228._4_4_;
                            auVar189._8_4_ = fVar130 * auVar228._8_4_;
                            auVar189._12_4_ = fVar131 * auVar228._12_4_;
                            auVar54 = vfmadd231ps_fma(auVar189,auVar72,auVar54);
                            auVar228 = vfmadd231ps_fma(auVar54,auVar84,auVar163);
                            auVar163 = vsubps_avx(auVar155,auVar260);
                            auVar118._0_4_ = auVar155._0_4_ + auVar260._0_4_;
                            auVar118._4_4_ = auVar155._4_4_ + auVar260._4_4_;
                            auVar118._8_4_ = auVar155._8_4_ + auVar260._8_4_;
                            auVar118._12_4_ = auVar155._12_4_ + auVar260._12_4_;
                            auVar260 = vsubps_avx(auVar233,auVar40);
                            auVar80._0_4_ = auVar233._0_4_ + auVar40._0_4_;
                            auVar80._4_4_ = auVar233._4_4_ + auVar40._4_4_;
                            auVar80._8_4_ = auVar233._8_4_ + auVar40._8_4_;
                            auVar80._12_4_ = auVar233._12_4_ + auVar40._12_4_;
                            auVar233 = vsubps_avx(auVar234,auVar70);
                            auVar56._0_4_ = auVar234._0_4_ + auVar70._0_4_;
                            auVar56._4_4_ = auVar234._4_4_ + auVar70._4_4_;
                            auVar56._8_4_ = auVar234._8_4_ + auVar70._8_4_;
                            auVar56._12_4_ = auVar234._12_4_ + auVar70._12_4_;
                            auVar157._0_4_ = auVar233._0_4_ * auVar80._0_4_;
                            auVar157._4_4_ = auVar233._4_4_ * auVar80._4_4_;
                            auVar157._8_4_ = auVar233._8_4_ * auVar80._8_4_;
                            auVar157._12_4_ = auVar233._12_4_ * auVar80._12_4_;
                            auVar54 = vfmsub231ps_fma(auVar157,auVar260,auVar56);
                            auVar57._0_4_ = auVar163._0_4_ * auVar56._0_4_;
                            auVar57._4_4_ = auVar163._4_4_ * auVar56._4_4_;
                            auVar57._8_4_ = auVar163._8_4_ * auVar56._8_4_;
                            auVar57._12_4_ = auVar163._12_4_ * auVar56._12_4_;
                            auVar70 = vfmsub231ps_fma(auVar57,auVar233,auVar118);
                            auVar119._0_4_ = auVar118._0_4_ * auVar260._0_4_;
                            auVar119._4_4_ = auVar118._4_4_ * auVar260._4_4_;
                            auVar119._8_4_ = auVar118._8_4_ * auVar260._8_4_;
                            auVar119._12_4_ = auVar118._12_4_ * auVar260._12_4_;
                            auVar155 = vfmsub231ps_fma(auVar119,auVar163,auVar80);
                            auVar81._0_4_ = fVar128 * auVar155._0_4_;
                            auVar81._4_4_ = fVar129 * auVar155._4_4_;
                            auVar81._8_4_ = fVar130 * auVar155._8_4_;
                            auVar81._12_4_ = fVar131 * auVar155._12_4_;
                            auVar70 = vfmadd231ps_fma(auVar81,auVar72,auVar70);
                            auVar234 = vfmadd231ps_fma(auVar70,auVar84,auVar54);
                            auVar173._0_4_ = auVar234._0_4_ + auVar175._0_4_ + auVar228._0_4_;
                            auVar173._4_4_ = auVar234._4_4_ + auVar175._4_4_ + auVar228._4_4_;
                            auVar173._8_4_ = auVar234._8_4_ + auVar175._8_4_ + auVar228._8_4_;
                            auVar173._12_4_ = auVar234._12_4_ + auVar175._12_4_ + auVar228._12_4_;
                            auVar70 = vminps_avx(auVar175,auVar228);
                            auVar54 = vminps_avx(auVar70,auVar234);
                            auVar70 = vandps_avx(auVar252,auVar173);
                            auVar120._0_4_ = auVar70._0_4_ * 1.1920929e-07;
                            auVar120._4_4_ = auVar70._4_4_ * 1.1920929e-07;
                            auVar120._8_4_ = auVar70._8_4_ * 1.1920929e-07;
                            auVar120._12_4_ = auVar70._12_4_ * 1.1920929e-07;
                            uVar28 = CONCAT44(auVar120._4_4_,auVar120._0_4_);
                            auVar158._0_8_ = uVar28 ^ 0x8000000080000000;
                            auVar158._8_4_ = -auVar120._8_4_;
                            auVar158._12_4_ = -auVar120._12_4_;
                            auVar54 = vcmpps_avx(auVar54,auVar158,5);
                            auVar155 = vmaxps_avx(auVar175,auVar228);
                            auVar155 = vmaxps_avx(auVar155,auVar234);
                            auVar155 = vcmpps_avx(auVar155,auVar120,2);
                            auVar54 = vorps_avx(auVar54,auVar155);
                            auVar155 = auVar127 & auVar54;
                            if ((((auVar155 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0 &&
                                 (auVar155 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar155 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar155[0xf]) {
                              auVar279 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar91 = ZEXT1664(auVar127);
                            }
                            else {
                              auVar58._0_4_ = fVar92 * auVar108._0_4_;
                              auVar58._4_4_ = fVar94 * auVar108._4_4_;
                              auVar58._8_4_ = fVar96 * auVar108._8_4_;
                              auVar58._12_4_ = fVar98 * auVar108._12_4_;
                              auVar82._0_4_ = fVar134 * auVar42._0_4_;
                              auVar82._4_4_ = fVar135 * auVar42._4_4_;
                              auVar82._8_4_ = fVar136 * auVar42._8_4_;
                              auVar82._12_4_ = fVar137 * auVar42._12_4_;
                              auVar234 = vfmsub213ps_fma(auVar42,auVar89,auVar58);
                              auVar121._0_4_ = fVar69 * auVar260._0_4_;
                              auVar121._4_4_ = fVar93 * auVar260._4_4_;
                              auVar121._8_4_ = fVar95 * auVar260._8_4_;
                              auVar121._12_4_ = fVar97 * auVar260._12_4_;
                              auVar159._0_4_ = fVar134 * auVar233._0_4_;
                              auVar159._4_4_ = fVar135 * auVar233._4_4_;
                              auVar159._8_4_ = fVar136 * auVar233._8_4_;
                              auVar159._12_4_ = fVar137 * auVar233._12_4_;
                              auVar40 = vfmsub213ps_fma(auVar233,auVar109,auVar121);
                              auVar155 = vandps_avx(auVar252,auVar58);
                              auVar233 = vandps_avx(auVar252,auVar121);
                              auVar155 = vcmpps_avx(auVar155,auVar233,1);
                              vVar8.field_0 =
                                   (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                   vblendvps_avx(auVar40,auVar234,auVar155);
                              auVar59._0_4_ = auVar163._0_4_ * fVar92;
                              auVar59._4_4_ = auVar163._4_4_ * fVar94;
                              auVar59._8_4_ = auVar163._8_4_ * fVar96;
                              auVar59._12_4_ = auVar163._12_4_ * fVar98;
                              auVar234 = vfmsub213ps_fma(auVar163,auVar89,auVar159);
                              auVar122._0_4_ = fVar69 * auVar41._0_4_;
                              auVar122._4_4_ = fVar93 * auVar41._4_4_;
                              auVar122._8_4_ = fVar95 * auVar41._8_4_;
                              auVar122._12_4_ = fVar97 * auVar41._12_4_;
                              auVar40 = vfmsub213ps_fma(auVar108,auVar255,auVar122);
                              auVar155 = vandps_avx(auVar252,auVar122);
                              auVar233 = vandps_avx(auVar252,auVar159);
                              auVar155 = vcmpps_avx(auVar155,auVar233,1);
                              vVar9.field_0 =
                                   (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                   vblendvps_avx(auVar234,auVar40,auVar155);
                              auVar234 = vfmsub213ps_fma(auVar41,auVar109,auVar82);
                              auVar260 = vfmsub213ps_fma(auVar260,auVar255,auVar59);
                              auVar155 = vandps_avx(auVar252,auVar82);
                              auVar233 = vandps_avx(auVar252,auVar59);
                              auVar155 = vcmpps_avx(auVar155,auVar233,1);
                              auVar155 = vblendvps_avx(auVar260,auVar234,auVar155);
                              local_38c8._0_4_ = auVar19._0_4_;
                              local_38c8._4_4_ = auVar19._4_4_;
                              fStack_38c0 = auVar19._8_4_;
                              auVar60._0_4_ = auVar155._0_4_ * (float)local_38c8._0_4_;
                              auVar60._4_4_ = auVar155._4_4_ * (float)local_38c8._4_4_;
                              auVar60._8_4_ = auVar155._8_4_ * fStack_38c0;
                              auVar60._12_4_ = auVar155._12_4_ * fVar131;
                              auVar72 = vfmadd213ps_fma(auVar72,(undefined1  [16])vVar9.field_0,
                                                        auVar60);
                              auVar72 = vfmadd213ps_fma(auVar84,(undefined1  [16])vVar8.field_0,
                                                        auVar72);
                              auVar61._0_4_ = auVar72._0_4_ + auVar72._0_4_;
                              auVar61._4_4_ = auVar72._4_4_ + auVar72._4_4_;
                              auVar61._8_4_ = auVar72._8_4_ + auVar72._8_4_;
                              auVar61._12_4_ = auVar72._12_4_ + auVar72._12_4_;
                              auVar83._0_4_ = auVar155._0_4_ * fVar39;
                              auVar83._4_4_ = auVar155._4_4_ * fVar66;
                              auVar83._8_4_ = auVar155._8_4_ * fVar67;
                              auVar83._12_4_ = auVar155._12_4_ * fVar68;
                              auVar72 = vfmadd213ps_fma(auVar180,(undefined1  [16])vVar9.field_0,
                                                        auVar83);
                              auVar84 = vfmadd213ps_fma(auVar85,(undefined1  [16])vVar8.field_0,
                                                        auVar72);
                              auVar72 = vrcpps_avx(auVar61);
                              auVar174._8_4_ = 0x3f800000;
                              auVar174._0_8_ = &DAT_3f8000003f800000;
                              auVar174._12_4_ = 0x3f800000;
                              auVar85 = vfnmadd213ps_fma(auVar72,auVar61,auVar174);
                              auVar72 = vfmadd132ps_fma(auVar85,auVar72,auVar72);
                              auVar123._0_4_ = (auVar84._0_4_ + auVar84._0_4_) * auVar72._0_4_;
                              auVar123._4_4_ = (auVar84._4_4_ + auVar84._4_4_) * auVar72._4_4_;
                              auVar123._8_4_ = (auVar84._8_4_ + auVar84._8_4_) * auVar72._8_4_;
                              auVar123._12_4_ = (auVar84._12_4_ + auVar84._12_4_) * auVar72._12_4_;
                              auVar72 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar84 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar123,2);
                              auVar85 = vcmpps_avx(auVar123,auVar72,2);
                              auVar84 = vandps_avx(auVar84,auVar85);
                              uVar28 = CONCAT44(auVar61._4_4_,auVar61._0_4_);
                              auVar160._0_8_ = uVar28 ^ 0x8000000080000000;
                              auVar160._8_4_ = -auVar61._8_4_;
                              auVar160._12_4_ = -auVar61._12_4_;
                              auVar85 = vcmpps_avx(auVar61,auVar160,4);
                              auVar84 = vandps_avx(auVar85,auVar84);
                              auVar91 = ZEXT1664(auVar127);
                              auVar54 = vandps_avx(auVar54,auVar127);
                              auVar84 = vpslld_avx(auVar84,0x1f);
                              auVar85 = vpsrad_avx(auVar84,0x1f);
                              auVar84 = auVar54 & auVar85;
                              if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar84 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar84 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && -1 < auVar84[0xf]) {
                                auVar279 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                              CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa
                                                                      )));
                              }
                              else {
                                auVar84 = vandps_avx(auVar85,auVar54);
                                pGVar4 = (context->scene->geometries).items
                                         [*(uint *)(lVar33 + 0x40 + uVar35 * 4)].ptr;
                                uVar22 = pGVar4->mask;
                                auVar86._4_4_ = uVar22;
                                auVar86._0_4_ = uVar22;
                                auVar86._8_4_ = uVar22;
                                auVar86._12_4_ = uVar22;
                                auVar54 = vpand_avx(auVar86,*(undefined1 (*) [16])(ray + 0x90));
                                auVar54 = vpcmpeqd_avx(auVar54,_DAT_01feba10);
                                auVar85 = auVar84 & ~auVar54;
                                auVar279 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                              CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa
                                                                      )));
                                if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar85 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar85 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar85[0xf] < '\0') {
                                  aVar64 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                           vandnps_avx(auVar54,auVar84);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar84 = vrcpps_avx(auVar173);
                                    auVar202._8_4_ = 0x3f800000;
                                    auVar202._0_8_ = &DAT_3f8000003f800000;
                                    auVar202._12_4_ = 0x3f800000;
                                    auVar54 = vfnmadd213ps_fma(auVar173,auVar84,auVar202);
                                    auVar54 = vfmadd132ps_fma(auVar54,auVar84,auVar84);
                                    auVar87._8_4_ = 0x219392ef;
                                    auVar87._0_8_ = 0x219392ef219392ef;
                                    auVar87._12_4_ = 0x219392ef;
                                    auVar84 = vcmpps_avx(auVar70,auVar87,5);
                                    auVar84 = vandps_avx(auVar84,auVar54);
                                    auVar162._0_4_ = auVar84._0_4_ * auVar175._0_4_;
                                    auVar162._4_4_ = auVar84._4_4_ * auVar175._4_4_;
                                    auVar162._8_4_ = auVar84._8_4_ * auVar175._8_4_;
                                    auVar162._12_4_ = auVar84._12_4_ * auVar175._12_4_;
                                    auVar70 = vminps_avx(auVar162,auVar202);
                                    auVar88._0_4_ = auVar84._0_4_ * auVar228._0_4_;
                                    auVar88._4_4_ = auVar84._4_4_ * auVar228._4_4_;
                                    auVar88._8_4_ = auVar84._8_4_ * auVar228._8_4_;
                                    auVar88._12_4_ = auVar84._12_4_ * auVar228._12_4_;
                                    auVar84 = vminps_avx(auVar88,auVar202);
                                    auVar54 = vsubps_avx(auVar202,auVar70);
                                    auVar85 = vsubps_avx(auVar202,auVar84);
                                    vblendvps_avx(auVar70,auVar54,auVar7);
                                    auVar84 = vblendvps_avx(auVar84,auVar85,auVar7);
                                    p0.field_0.field_0.x.field_0 =
                                         (vfloat_impl<4>)(vfloat_impl<4>)vVar8.field_0;
                                    p0.field_0.field_0.y.field_0 =
                                         (vfloat_impl<4>)(vfloat_impl<4>)vVar9.field_0;
                                    p0.field_0._32_16_ = auVar155;
                                    vpcmpeqd_avx2(ZEXT1632(auVar84),ZEXT1632(auVar84));
                                    auVar84 = vblendvps_avx(auVar72,auVar123,
                                                            (undefined1  [16])aVar64);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar84;
                                    itime.field_0 = aVar64;
                                    p1.field_0._0_8_ = &itime;
                                    p1.field_0._8_8_ = pGVar4->userPtr;
                                    p1.field_0._16_8_ = context->user;
                                    p1.field_0._24_8_ = ray;
                                    p1.field_0._32_8_ = &p0;
                                    p1.field_0._40_4_ = 4;
                                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      (*pGVar4->occlusionFilterN)
                                                ((RTCFilterFunctionNArguments *)&p1);
                                      auVar279 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                                    CONCAT48(0x3f7ffffa,
                                                                             0x3f7ffffa3f7ffffa)));
                                    }
                                    if (itime.field_0 ==
                                        (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                      auVar84 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                                      auVar84 = auVar84 ^ _DAT_01febe20;
                                    }
                                    else {
                                      p_Var6 = context->args->filter;
                                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                        (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                        auVar279 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                                      CONCAT48(0x3f7ffffa,
                                                                               0x3f7ffffa3f7ffffa)))
                                        ;
                                      }
                                      auVar70 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                             (undefined1  [16])itime.field_0);
                                      auVar84 = auVar70 ^ _DAT_01febe20;
                                      auVar125._8_4_ = 0xff800000;
                                      auVar125._0_8_ = 0xff800000ff800000;
                                      auVar125._12_4_ = 0xff800000;
                                      auVar70 = vblendvps_avx(auVar125,*(undefined1 (*) [16])
                                                                        (p1.field_0._24_8_ + 0x80),
                                                              auVar70);
                                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar70;
                                    }
                                    auVar84 = vpslld_avx(auVar84,0x1f);
                                    aVar64 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                             vpsrad_avx(auVar84,0x1f);
                                    auVar72 = vblendvps_avx(auVar72,*(undefined1 (*) [16])pRVar1,
                                                            auVar84);
                                    *(undefined1 (*) [16])pRVar1 = auVar72;
                                  }
                                  auVar127 = vpandn_avx((undefined1  [16])aVar64,auVar127);
                                  auVar91 = ZEXT1664(auVar127);
                                }
                              }
                            }
                            auVar127 = auVar91._0_16_;
                            bVar38 = (((auVar127 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0 ||
                                      (auVar127 >> 0x3f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                     (auVar127 >> 0x5f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) || auVar91[0xf] < '\0';
                          }
                          auVar127 = auVar91._0_16_;
                          if ((!bVar38) || (bVar38 = 2 < uVar35, uVar35 = uVar35 + 1, bVar38))
                          break;
                        }
                        auVar72 = vandps_avx(auVar127,auVar73);
                        auVar127 = auVar73 & auVar127;
                      } while (((((auVar127 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0 ||
                                 (auVar127 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || (auVar127 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar127[0xf] < '\0') &&
                              (uVar24 = uVar24 + 1, auVar73 = auVar72, uVar24 < uVar36 - 8));
                      auVar127 = vpcmpeqd_avx(auVar73,auVar73);
                      aVar65._0_4_ = auVar72._0_4_ ^ auVar127._0_4_;
                      aVar65._4_4_ = auVar72._4_4_ ^ auVar127._4_4_;
                      aVar65._8_4_ = auVar72._8_4_ ^ auVar127._8_4_;
                      aVar65._12_4_ = auVar72._12_4_ ^ auVar127._12_4_;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vorps_avx((undefined1  [16])aVar65,(undefined1  [16])terminated.field_0);
                    auVar127 = auVar127 & ~(undefined1  [16])terminated.field_0;
                    if ((((auVar127 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar127 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar127 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar127[0xf]) goto LAB_00632ef9;
                    auVar126._8_4_ = 0xff800000;
                    auVar126._0_8_ = 0xff800000ff800000;
                    auVar126._12_4_ = 0xff800000;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar126,
                                       (undefined1  [16])terminated.field_0);
                    iVar23 = 0;
                    break;
                  }
                  goto LAB_00632f0a;
                }
                uVar24 = root.ptr & 0xfffffffffffffff0;
                auVar127 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar127,6);
                auVar91 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                uVar36 = 0;
                sVar27 = 8;
                do {
                  sVar3 = *(size_t *)(uVar24 + uVar36 * 8);
                  root.ptr = sVar27;
                  if (sVar3 != 8) {
                    aVar71 = auVar91._0_16_;
                    uVar26 = *(undefined4 *)(uVar24 + 0x100 + uVar36 * 4);
                    auVar101._4_4_ = uVar26;
                    auVar101._0_4_ = uVar26;
                    auVar101._8_4_ = uVar26;
                    auVar101._12_4_ = uVar26;
                    uVar26 = *(undefined4 *)(uVar24 + 0x40 + uVar36 * 4);
                    auVar146._4_4_ = uVar26;
                    auVar146._0_4_ = uVar26;
                    auVar146._8_4_ = uVar26;
                    auVar146._12_4_ = uVar26;
                    auVar72 = *(undefined1 (*) [16])(ray + 0x70);
                    auVar84 = vfmadd231ps_fma(auVar146,auVar72,auVar101);
                    uVar26 = *(undefined4 *)(uVar24 + 0x140 + uVar36 * 4);
                    auVar102._4_4_ = uVar26;
                    auVar102._0_4_ = uVar26;
                    auVar102._8_4_ = uVar26;
                    auVar102._12_4_ = uVar26;
                    uVar26 = *(undefined4 *)(uVar24 + 0x80 + uVar36 * 4);
                    auVar165._4_4_ = uVar26;
                    auVar165._0_4_ = uVar26;
                    auVar165._8_4_ = uVar26;
                    auVar165._12_4_ = uVar26;
                    auVar70 = vfmadd231ps_fma(auVar165,auVar72,auVar102);
                    uVar26 = *(undefined4 *)(uVar24 + 0x180 + uVar36 * 4);
                    auVar103._4_4_ = uVar26;
                    auVar103._0_4_ = uVar26;
                    auVar103._8_4_ = uVar26;
                    auVar103._12_4_ = uVar26;
                    uVar26 = *(undefined4 *)(uVar24 + 0xc0 + uVar36 * 4);
                    auVar181._4_4_ = uVar26;
                    auVar181._0_4_ = uVar26;
                    auVar181._8_4_ = uVar26;
                    auVar181._12_4_ = uVar26;
                    auVar54 = vfmadd231ps_fma(auVar181,auVar72,auVar103);
                    uVar26 = *(undefined4 *)(uVar24 + 0x120 + uVar36 * 4);
                    auVar104._4_4_ = uVar26;
                    auVar104._0_4_ = uVar26;
                    auVar104._8_4_ = uVar26;
                    auVar104._12_4_ = uVar26;
                    uVar26 = *(undefined4 *)(uVar24 + 0x60 + uVar36 * 4);
                    auVar195._4_4_ = uVar26;
                    auVar195._0_4_ = uVar26;
                    auVar195._8_4_ = uVar26;
                    auVar195._12_4_ = uVar26;
                    auVar155 = vfmadd231ps_fma(auVar195,auVar72,auVar104);
                    uVar26 = *(undefined4 *)(uVar24 + 0x160 + uVar36 * 4);
                    auVar105._4_4_ = uVar26;
                    auVar105._0_4_ = uVar26;
                    auVar105._8_4_ = uVar26;
                    auVar105._12_4_ = uVar26;
                    uVar26 = *(undefined4 *)(uVar24 + 0xa0 + uVar36 * 4);
                    auVar207._4_4_ = uVar26;
                    auVar207._0_4_ = uVar26;
                    auVar207._8_4_ = uVar26;
                    auVar207._12_4_ = uVar26;
                    auVar85 = vfmadd231ps_fma(auVar207,auVar72,auVar105);
                    uVar26 = *(undefined4 *)(uVar24 + 0x1a0 + uVar36 * 4);
                    auVar106._4_4_ = uVar26;
                    auVar106._0_4_ = uVar26;
                    auVar106._8_4_ = uVar26;
                    auVar106._12_4_ = uVar26;
                    uVar26 = *(undefined4 *)(uVar24 + 0xe0 + uVar36 * 4);
                    auVar220._4_4_ = uVar26;
                    auVar220._0_4_ = uVar26;
                    auVar220._8_4_ = uVar26;
                    auVar220._12_4_ = uVar26;
                    auVar180 = vfmadd231ps_fma(auVar220,auVar72,auVar106);
                    auVar15._8_8_ = tray.org.field_0._8_8_;
                    auVar15._0_8_ = tray.org.field_0._0_8_;
                    auVar16._8_8_ = tray.org.field_0._24_8_;
                    auVar16._0_8_ = tray.org.field_0._16_8_;
                    auVar17._8_8_ = tray.org.field_0._40_8_;
                    auVar17._0_8_ = tray.org.field_0._32_8_;
                    auVar84 = vsubps_avx(auVar84,auVar15);
                    auVar147._0_4_ = tray.rdir.field_0._0_4_ * auVar84._0_4_;
                    auVar147._4_4_ = tray.rdir.field_0._4_4_ * auVar84._4_4_;
                    auVar147._8_4_ = tray.rdir.field_0._8_4_ * auVar84._8_4_;
                    auVar147._12_4_ = tray.rdir.field_0._12_4_ * auVar84._12_4_;
                    auVar84 = vsubps_avx(auVar70,auVar16);
                    auVar166._0_4_ = tray.rdir.field_0._16_4_ * auVar84._0_4_;
                    auVar166._4_4_ = tray.rdir.field_0._20_4_ * auVar84._4_4_;
                    auVar166._8_4_ = tray.rdir.field_0._24_4_ * auVar84._8_4_;
                    auVar166._12_4_ = tray.rdir.field_0._28_4_ * auVar84._12_4_;
                    auVar84 = vsubps_avx(auVar54,auVar17);
                    auVar182._0_4_ = tray.rdir.field_0._32_4_ * auVar84._0_4_;
                    auVar182._4_4_ = tray.rdir.field_0._36_4_ * auVar84._4_4_;
                    auVar182._8_4_ = tray.rdir.field_0._40_4_ * auVar84._8_4_;
                    auVar182._12_4_ = tray.rdir.field_0._44_4_ * auVar84._12_4_;
                    auVar84 = vsubps_avx(auVar155,auVar15);
                    auVar196._0_4_ = tray.rdir.field_0._0_4_ * auVar84._0_4_;
                    auVar196._4_4_ = tray.rdir.field_0._4_4_ * auVar84._4_4_;
                    auVar196._8_4_ = tray.rdir.field_0._8_4_ * auVar84._8_4_;
                    auVar196._12_4_ = tray.rdir.field_0._12_4_ * auVar84._12_4_;
                    auVar84 = vsubps_avx(auVar85,auVar16);
                    auVar208._0_4_ = tray.rdir.field_0._16_4_ * auVar84._0_4_;
                    auVar208._4_4_ = tray.rdir.field_0._20_4_ * auVar84._4_4_;
                    auVar208._8_4_ = tray.rdir.field_0._24_4_ * auVar84._8_4_;
                    auVar208._12_4_ = tray.rdir.field_0._28_4_ * auVar84._12_4_;
                    auVar84 = vsubps_avx(auVar180,auVar17);
                    auVar221._0_4_ = tray.rdir.field_0._32_4_ * auVar84._0_4_;
                    auVar221._4_4_ = tray.rdir.field_0._36_4_ * auVar84._4_4_;
                    auVar221._8_4_ = tray.rdir.field_0._40_4_ * auVar84._8_4_;
                    auVar221._12_4_ = tray.rdir.field_0._44_4_ * auVar84._12_4_;
                    auVar84 = vpminsd_avx(auVar147,auVar196);
                    auVar70 = vpminsd_avx(auVar166,auVar208);
                    auVar84 = vpmaxsd_avx(auVar84,auVar70);
                    auVar70 = vpminsd_avx(auVar182,auVar221);
                    auVar84 = vpmaxsd_avx(auVar84,auVar70);
                    auVar107._0_4_ = auVar279._0_4_ * auVar84._0_4_;
                    auVar107._4_4_ = auVar279._4_4_ * auVar84._4_4_;
                    auVar107._8_4_ = auVar279._8_4_ * auVar84._8_4_;
                    auVar107._12_4_ = auVar279._12_4_ * auVar84._12_4_;
                    auVar84 = vpmaxsd_avx(auVar147,auVar196);
                    auVar70 = vpmaxsd_avx(auVar166,auVar208);
                    auVar70 = vpminsd_avx(auVar84,auVar70);
                    auVar84 = vpmaxsd_avx(auVar182,auVar221);
                    auVar70 = vpminsd_avx(auVar70,auVar84);
                    auVar84 = vpmaxsd_avx(auVar107,(undefined1  [16])tray.tnear.field_0);
                    auVar167._0_4_ = auVar70._0_4_ * 1.0000004;
                    auVar167._4_4_ = auVar70._4_4_ * 1.0000004;
                    auVar167._8_4_ = auVar70._8_4_ * 1.0000004;
                    auVar167._12_4_ = auVar70._12_4_ * 1.0000004;
                    auVar70 = vpminsd_avx(auVar167,(undefined1  [16])tray.tfar.field_0);
                    if ((uVar22 & 7) == 6) {
                      auVar84 = vcmpps_avx(auVar84,auVar70,2);
                      uVar26 = *(undefined4 *)(uVar24 + 0x1c0 + uVar36 * 4);
                      auVar168._4_4_ = uVar26;
                      auVar168._0_4_ = uVar26;
                      auVar168._8_4_ = uVar26;
                      auVar168._12_4_ = uVar26;
                      auVar70 = vcmpps_avx(auVar168,auVar72,2);
                      uVar26 = *(undefined4 *)(uVar24 + 0x1e0 + uVar36 * 4);
                      auVar183._4_4_ = uVar26;
                      auVar183._0_4_ = uVar26;
                      auVar183._8_4_ = uVar26;
                      auVar183._12_4_ = uVar26;
                      auVar72 = vcmpps_avx(auVar72,auVar183,1);
                      auVar72 = vandps_avx(auVar70,auVar72);
                      auVar72 = vandps_avx(auVar72,auVar84);
                    }
                    else {
                      auVar72 = vcmpps_avx(auVar84,auVar70,2);
                    }
                    auVar72 = vandps_avx(auVar72,auVar127);
                    auVar72 = vpslld_avx(auVar72,0x1f);
                    if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar72[0xf]) {
                      auVar91 = ZEXT1664((undefined1  [16])aVar71);
                    }
                    else {
                      auVar148._8_4_ = 0x7f800000;
                      auVar148._0_8_ = 0x7f8000007f800000;
                      auVar148._12_4_ = 0x7f800000;
                      auVar72 = vblendvps_avx(auVar148,auVar107,auVar72);
                      auVar91 = ZEXT1664(auVar72);
                      root.ptr = sVar3;
                      if (sVar27 != 8) {
                        pNVar37->ptr = sVar27;
                        pNVar37 = pNVar37 + 1;
                        *paVar34 = aVar71;
                        paVar34 = paVar34 + 1;
                      }
                    }
                  }
                } while ((sVar3 != 8) &&
                        (bVar38 = uVar36 < 7, uVar36 = uVar36 + 1, sVar27 = root.ptr, bVar38));
                iVar23 = 0;
                if (root.ptr == 8) {
LAB_00631a35:
                  bVar38 = false;
                  iVar23 = 4;
                }
                else {
                  auVar127 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                        (undefined1  [16])auVar91._0_16_,6);
                  uVar26 = vmovmskps_avx(auVar127);
                  bVar38 = true;
                  if ((uint)POPCOUNT(uVar26) <= uVar30) {
                    pNVar37->ptr = root.ptr;
                    pNVar37 = pNVar37 + 1;
                    *paVar34 = auVar91._0_16_;
                    paVar34 = paVar34 + 1;
                    goto LAB_00631a35;
                  }
                }
              } while (bVar38);
            }
          }
        }
      } while (iVar23 != 3);
      auVar7 = vandps_avx(auVar90,(undefined1  [16])terminated.field_0);
      auVar90._8_4_ = 0xff800000;
      auVar90._0_8_ = 0xff800000ff800000;
      auVar90._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar90);
      *(undefined1 (*) [16])pRVar1 = auVar7;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }